

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

vector<CNetAddr,_std::allocator<CNetAddr>_> *
WrappedGetAddrInfo(vector<CNetAddr,_std::allocator<CNetAddr>_> *__return_storage_ptr__,string *name,
                  bool allow_lookup)

{
  int iVar1;
  undefined7 in_register_00000011;
  addrinfo *__ai;
  addrinfo *paVar2;
  long in_FS_OFFSET;
  addrinfo *ai_res;
  addrinfo *local_50;
  addrinfo local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_protocol = 6;
  local_48.ai_family = 0;
  local_48.ai_socktype = 1;
  local_48.ai_flags = 4;
  if ((int)CONCAT71(in_register_00000011,allow_lookup) != 0) {
    local_48.ai_flags = 0x20;
  }
  local_50 = (addrinfo *)0x0;
  iVar1 = getaddrinfo((name->_M_dataplus)._M_p,(char *)0x0,&local_48,&local_50);
  if (iVar1 == 0) {
LAB_006c2e9b:
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar2 = local_50;
    if (local_50 == (addrinfo *)0x0) {
      __ai = (addrinfo *)0x0;
    }
    else {
      do {
        iVar1 = paVar2->ai_family;
        if (iVar1 == 2) {
          if (paVar2->ai_addrlen < 0x10) {
            __assert_fail("ai_trav->ai_addrlen >= sizeof(sockaddr_in)",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
                          ,0x53,
                          "std::vector<CNetAddr> WrappedGetAddrInfo(const std::string &, bool)");
          }
          std::vector<CNetAddr,std::allocator<CNetAddr>>::emplace_back<in_addr&>
                    ((vector<CNetAddr,std::allocator<CNetAddr>> *)__return_storage_ptr__,
                     (in_addr *)(paVar2->ai_addr->sa_data + 2));
          iVar1 = paVar2->ai_family;
        }
        if (iVar1 == 10) {
          if (paVar2->ai_addrlen < 0x1c) {
            __assert_fail("ai_trav->ai_addrlen >= sizeof(sockaddr_in6)",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
                          ,0x57,
                          "std::vector<CNetAddr> WrappedGetAddrInfo(const std::string &, bool)");
          }
          std::vector<CNetAddr,std::allocator<CNetAddr>>::
          emplace_back<in6_addr_const&,unsigned_int_const&>
                    ((vector<CNetAddr,std::allocator<CNetAddr>> *)__return_storage_ptr__,
                     (in6_addr *)(paVar2->ai_addr->sa_data + 6),
                     (uint *)(paVar2->ai_addr[1].sa_data + 6));
        }
        paVar2 = paVar2->ai_next;
        __ai = local_50;
      } while (paVar2 != (addrinfo *)0x0);
    }
    freeaddrinfo(__ai);
  }
  else {
    if ((local_48.ai_flags & 0x20U) != 0) {
      local_48.ai_flags = local_48.ai_flags & 0xffffffdf;
      iVar1 = getaddrinfo((name->_M_dataplus)._M_p,(char *)0x0,&local_48,&local_50);
      if (iVar1 == 0) goto LAB_006c2e9b;
    }
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CNetAddr> WrappedGetAddrInfo(const std::string& name, bool allow_lookup)
{
    addrinfo ai_hint{};
    // We want a TCP port, which is a streaming socket type
    ai_hint.ai_socktype = SOCK_STREAM;
    ai_hint.ai_protocol = IPPROTO_TCP;
    // We don't care which address family (IPv4 or IPv6) is returned
    ai_hint.ai_family = AF_UNSPEC;

    // If we allow lookups of hostnames, use the AI_ADDRCONFIG flag to only
    // return addresses whose family we have an address configured for.
    //
    // If we don't allow lookups, then use the AI_NUMERICHOST flag for
    // getaddrinfo to only decode numerical network addresses and suppress
    // hostname lookups.
    ai_hint.ai_flags = allow_lookup ? AI_ADDRCONFIG : AI_NUMERICHOST;

    addrinfo* ai_res{nullptr};
    const int n_err{getaddrinfo(name.c_str(), nullptr, &ai_hint, &ai_res)};
    if (n_err != 0) {
        if ((ai_hint.ai_flags & AI_ADDRCONFIG) == AI_ADDRCONFIG) {
            // AI_ADDRCONFIG on some systems may exclude loopback-only addresses
            // If first lookup failed we perform a second lookup without AI_ADDRCONFIG
            ai_hint.ai_flags = (ai_hint.ai_flags & ~AI_ADDRCONFIG);
            const int n_err_retry{getaddrinfo(name.c_str(), nullptr, &ai_hint, &ai_res)};
            if (n_err_retry != 0) {
                return {};
            }
        } else {
            return {};
        }
    }

    // Traverse the linked list starting with ai_trav.
    addrinfo* ai_trav{ai_res};
    std::vector<CNetAddr> resolved_addresses;
    while (ai_trav != nullptr) {
        if (ai_trav->ai_family == AF_INET) {
            assert(ai_trav->ai_addrlen >= sizeof(sockaddr_in));
            resolved_addresses.emplace_back(reinterpret_cast<sockaddr_in*>(ai_trav->ai_addr)->sin_addr);
        }
        if (ai_trav->ai_family == AF_INET6) {
            assert(ai_trav->ai_addrlen >= sizeof(sockaddr_in6));
            const sockaddr_in6* s6{reinterpret_cast<sockaddr_in6*>(ai_trav->ai_addr)};
            resolved_addresses.emplace_back(s6->sin6_addr, s6->sin6_scope_id);
        }
        ai_trav = ai_trav->ai_next;
    }
    freeaddrinfo(ai_res);

    return resolved_addresses;
}